

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.h
# Opt level: O0

void __thiscall asl::HttpMessage::put(HttpMessage *this,char *body)

{
  size_t sVar1;
  Array<unsigned_char> local_20;
  char *local_18;
  char *body_local;
  HttpMessage *this_local;
  
  local_18 = body;
  body_local = (char *)this;
  sVar1 = strlen(body);
  Array<unsigned_char>::Array(&local_20,(uchar *)body,(int)sVar1);
  put(this,&local_20);
  Array<unsigned_char>::~Array(&local_20);
  return;
}

Assistant:

void put(const char* body) { put(ByteArray((const byte*)body, (int)strlen(body))); }